

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O1

void __thiscall
Eigen::IOFormat::IOFormat
          (IOFormat *this,int _precision,int _flags,string *_coeffSeparator,string *_rowSeparator,
          string *_rowPrefix,string *_rowSuffix,string *_matPrefix,string *_matSuffix)

{
  pointer pcVar1;
  ulong uVar2;
  
  (this->matPrefix)._M_dataplus._M_p = (pointer)&(this->matPrefix).field_2;
  pcVar1 = (_matPrefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + _matPrefix->_M_string_length);
  (this->matSuffix)._M_dataplus._M_p = (pointer)&(this->matSuffix).field_2;
  pcVar1 = (_matSuffix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->matSuffix,pcVar1,pcVar1 + _matSuffix->_M_string_length);
  (this->rowPrefix)._M_dataplus._M_p = (pointer)&(this->rowPrefix).field_2;
  pcVar1 = (_rowPrefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rowPrefix,pcVar1,pcVar1 + _rowPrefix->_M_string_length);
  (this->rowSuffix)._M_dataplus._M_p = (pointer)&(this->rowSuffix).field_2;
  pcVar1 = (_rowSuffix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rowSuffix,pcVar1,pcVar1 + _rowSuffix->_M_string_length);
  (this->rowSeparator)._M_dataplus._M_p = (pointer)&(this->rowSeparator).field_2;
  pcVar1 = (_rowSeparator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rowSeparator,pcVar1,pcVar1 + _rowSeparator->_M_string_length);
  (this->rowSpacer)._M_dataplus._M_p = (pointer)&(this->rowSpacer).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->rowSpacer,"");
  (this->coeffSeparator)._M_dataplus._M_p = (pointer)&(this->coeffSeparator).field_2;
  pcVar1 = (_coeffSeparator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->coeffSeparator,pcVar1,pcVar1 + _coeffSeparator->_M_string_length);
  this->precision = _precision;
  this->flags = _flags;
  for (uVar2 = (ulong)(uint)(this->matSuffix)._M_string_length;
      (0 < (int)uVar2 && ((this->matSuffix)._M_dataplus._M_p[uVar2 - 1] != '\n')); uVar2 = uVar2 - 1
      ) {
    std::__cxx11::string::push_back((char)&this->rowSpacer);
  }
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="")
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), precision(_precision), flags(_flags)
  {
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }